

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_expression_rec
          (xpath_parser *this,xpath_ast_node *lhs,int limit)

{
  xpath_lexer *lexer;
  xpath_parse_result *pxVar1;
  xpath_ast_node *lhs_00;
  xpath_ast_node *pxVar2;
  int limit_00;
  binary_op_t bVar3;
  binary_op_t bVar4;
  
  lexer = &this->_lexer;
  bVar3 = binary_op_t::parse(lexer);
  if (limit <= bVar3.precedence && bVar3.asttype != ast_unknown) {
    while( true ) {
      xpath_lexer::next(lexer);
      lhs_00 = parse_path_or_unary_expression(this);
      if (lhs_00 == (xpath_ast_node *)0x0) break;
      bVar4 = binary_op_t::parse(lexer);
      limit_00 = bVar4.precedence;
      if (bVar3.precedence < limit_00 && bVar4.asttype != ast_unknown) {
        do {
          lhs_00 = parse_expression_rec(this,lhs_00,limit_00);
          if (lhs_00 == (xpath_ast_node *)0x0) goto LAB_00114090;
          bVar4 = binary_op_t::parse(lexer);
          limit_00 = bVar4.precedence;
        } while ((bVar4.asttype != ast_unknown) && (bVar3.precedence < limit_00));
      }
      if (bVar3.asttype == ast_op_union) {
        if ((lhs->_rettype == '\x01') && (lhs_00->_rettype == '\x01')) {
          pxVar2 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar2 != (xpath_ast_node *)0x0) {
            pxVar2->_type = '\x0f';
            goto LAB_00114027;
          }
        }
        else {
          pxVar1 = this->_result;
          pxVar1->error = "Union operator has to be applied to node sets";
          pxVar1->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
        }
        break;
      }
      pxVar2 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar2 == (xpath_ast_node *)0x0) break;
      pxVar2->_type = (char)bVar3.asttype;
LAB_00114027:
      pxVar2->_rettype = (char)bVar3.rettype;
      pxVar2->_axis = '\0';
      pxVar2->_test = '\0';
      pxVar2->_left = lhs;
      pxVar2->_right = lhs_00;
      pxVar2->_next = (xpath_ast_node *)0x0;
      bVar3 = binary_op_t::parse(lexer);
      if (bVar3.asttype == ast_unknown) {
        return pxVar2;
      }
      lhs = pxVar2;
      if (bVar3.precedence < limit) {
        return pxVar2;
      }
    }
LAB_00114090:
    lhs = (xpath_ast_node *)0x0;
  }
  return lhs;
}

Assistant:

xpath_ast_node* parse_expression_rec(xpath_ast_node* lhs, int limit)
		{
			binary_op_t op = binary_op_t::parse(_lexer);

			while (op.asttype != ast_unknown && op.precedence >= limit)
			{
				_lexer.next();

				xpath_ast_node* rhs = parse_path_or_unary_expression();
				if (!rhs) return 0;

				binary_op_t nextop = binary_op_t::parse(_lexer);

				while (nextop.asttype != ast_unknown && nextop.precedence > op.precedence)
				{
					rhs = parse_expression_rec(rhs, nextop.precedence);
					if (!rhs) return 0;

					nextop = binary_op_t::parse(_lexer);
				}

				if (op.asttype == ast_op_union && (lhs->rettype() != xpath_type_node_set || rhs->rettype() != xpath_type_node_set))
					return error("Union operator has to be applied to node sets");

				lhs = alloc_node(op.asttype, op.rettype, lhs, rhs);
				if (!lhs) return 0;

				op = binary_op_t::parse(_lexer);
			}

			return lhs;
		}